

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_long>::test_one<(libdivide::Branching)0>
          (DivideTest<unsigned_long> *this,unsigned_long numer,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)0> *the_divider)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  unsigned_long result;
  unsigned_long expect;
  uint64_t t;
  uint64_t q;
  __uint128_t rl;
  __uint128_t yl;
  __uint128_t xl;
  int in_stack_fffffffffffffef4;
  DivideTest<unsigned_long> *in_stack_fffffffffffffef8;
  ulong local_50;
  
  bVar1 = (byte)in_RCX[1];
  if (*in_RCX == 0) {
    local_50 = in_RSI >> (bVar1 & 0x3f);
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_RSI;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *in_RCX;
    local_50 = SUB168(auVar2 * auVar3,8);
    if ((bVar1 & 0x40) == 0) {
      local_50 = local_50 >> (bVar1 & 0x3f);
    }
    else {
      local_50 = (in_RSI - local_50 >> 1) + local_50 >> (bVar1 & 0x3f);
    }
  }
  if (local_50 != in_RSI / in_RDX) {
    std::operator<<((ostream *)&std::cerr,"Failure for ");
    testcase_name_abi_cxx11_(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    std::operator<<((ostream *)&std::cerr,(string *)&stack0xfffffffffffffef8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    std::operator<<((ostream *)&std::cerr,": ");
    std::ostream::operator<<((ostream *)&std::cerr,in_RSI);
    std::operator<<((ostream *)&std::cerr," / ");
    std::ostream::operator<<((ostream *)&std::cerr,in_RDX);
    std::operator<<((ostream *)&std::cerr," = ");
    std::ostream::operator<<((ostream *)&std::cerr,in_RSI / in_RDX);
    std::operator<<((ostream *)&std::cerr,", but got ");
    std::ostream::operator<<((ostream *)&std::cerr,local_50);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(1);
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }